

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

void __thiscall
kratos::FSM::generate_state_transition
          (FSM *this,Enum *enum_def,EnumVar *current_state,EnumVar *next_state,
          unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *state_name_mapping)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  undefined1 this_00 [8];
  element_type *this_01;
  _Alloc_hider _Var6;
  element_type *peVar7;
  element_type *peVar8;
  int iVar9;
  InternalException *this_02;
  bool bVar10;
  _Base_ptr p_Var11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __k;
  _Base_ptr p_Var12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  bool bVar14;
  string_view format_str;
  format_args args;
  undefined1 local_160 [8];
  shared_ptr<kratos::CombinationalStmtBlock> state_comb;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  undefined1 local_128 [8];
  FSMState *next_fsm_state;
  undefined1 auStack_118 [8];
  shared_ptr<kratos::FunctionStmtBlock> func_def;
  shared_ptr<kratos::IfStmt> top_if;
  _Alloc_hider local_e8;
  shared_ptr<kratos::SwitchStmt> case_state_comb;
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  transitions;
  undefined1 auStack_a8 [8];
  shared_ptr<kratos::FunctionCallStmt> func_stmt;
  shared_ptr<kratos::IfStmt> if_;
  undefined1 auStack_78 [8];
  shared_ptr<kratos::AssignStmt> stmt_1;
  shared_ptr<kratos::IfStmt> new_if;
  shared_ptr<kratos::AssignStmt> stmt;
  
  Generator::combinational((Generator *)local_160);
  auStack_118 = (undefined1  [8])0x0;
  func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (this->moore_ == false) {
    get_func_def((FSM *)&new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    peVar8 = stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auStack_118 = (undefined1  [8])
                  new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    this_01 = func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)peVar8;
    if (this_01 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(current_state->super_Var).super_enable_shared_from_this<kratos::Var>);
  local_e8._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::SwitchStmt,std::allocator<kratos::SwitchStmt>,std::shared_ptr<kratos::Var>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&case_state_comb,(SwitchStmt **)&local_e8
             ,(_Sp_alloc_shared_tag<std::allocator<kratos::SwitchStmt>_>)
              &state_comb.
               super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount,
             (shared_ptr<kratos::Var> *)
             &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_ptr<kratos::SwitchStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::SwitchStmt,kratos::SwitchStmt>
            ((__shared_ptr<kratos::SwitchStmt,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
             (SwitchStmt *)local_e8._M_p);
  if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
             &state_comb.
              super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this,false);
  this_00 = local_160;
  __k = state_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  do {
    local_160 = this_00;
    if (__k._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      Var::assign((Var *)&case_state_comb.
                          super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&next_state->super_Var,(AssignmentType)current_state);
      new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
           case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
      stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           transitions.
           super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      StmtBlock::add_stmt((StmtBlock *)this_00,
                          (shared_ptr<kratos::Stmt> *)
                          &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      _Var6._M_p = local_e8._M_p;
      p_Var5 = (_Base_ptr)(local_e8._M_p + 0xe8);
      p_Var11 = p_Var5;
      for (p_Var12 = *(_Base_ptr *)(local_e8._M_p + 0xf0); p_Var12 != (_Base_ptr)0x0;
          p_Var12 = p_Var12->_M_left) {
        p_Var11 = p_Var12;
      }
      p_Var12 = p_Var5;
      if ((p_Var11 != p_Var5) && (p_Var12 = p_Var11, *(long *)(p_Var11 + 1) != 0)) {
        p_Var12 = p_Var5;
      }
      if ((p_Var12 == p_Var5) &&
         (uVar4 = *(ulong *)(local_e8._M_p + 0x108) - 1,
         (*(ulong *)(local_e8._M_p + 0x108) ^ uVar4) <= uVar4)) {
        new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        Var::assign((Var *)&stmt_1.
                            super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,&next_state->super_Var,(AssignmentType)current_state);
        peVar7 = new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount = stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
        stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        SwitchStmt::add_switch_case
                  ((SwitchStmt *)_Var6._M_p,
                   (shared_ptr<kratos::Const> *)
                   &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   (shared_ptr<kratos::Stmt> *)
                   &case_state_comb.
                    super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        if (peVar7 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7);
        }
        if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
        }
      }
      new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_p;
      stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if (case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pvVar3 = &((case_state_comb.
                      super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar3->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar3->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          pvVar3 = &((case_state_comb.
                      super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar3->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar3->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      StmtBlock::add_stmt((StmtBlock *)local_160,
                          (shared_ptr<kratos::Stmt> *)
                          &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (state_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        operator_delete(state_comb.
                        super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi,
                        (long)states.
                              super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)state_comb.
                              super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
      }
      if (case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   case_state_comb.
                   super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   func_def.
                   super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
      }
      if (state_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   state_comb.
                   super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      return;
    }
    std::__detail::
    _Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::at((_Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          *)state_name_mapping,(key_type *)__k._M_pi);
    func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::
    vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
    ::vector((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
              *)&case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,&((key_type)(__k._M_pi)->_vptr__Sp_counted_base)->transitions_);
    if ((long)transitions.
              super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start -
        (long)case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == 0x10) {
      bVar14 = (case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_vptr__Sp_counted_base == (_func_int **)0x0;
    }
    else {
      bVar14 = false;
    }
    if (case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        transitions.
        super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar10 = false;
    }
    else {
      bVar10 = false;
      _Var13 = case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
      do {
        if ((_Var13._M_pi)->_vptr__Sp_counted_base == (_func_int **)0x0) {
          if ((long)transitions.
                    super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)case_state_comb.
                    super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi == 0x10) {
            in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                     )*(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                        *)&(_Var13._M_pi)->_M_use_count;
            get_next_state_stmt((FSM *)&new_if.
                                        super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,(Enum *)this,(EnumVar *)enum_def,
                                (FSMState *)next_state,
                                (FSMState *)(__k._M_pi)->_vptr__Sp_counted_base,
                                (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_R9.values_);
            _Var6._M_p = local_e8._M_p;
            Enum::get_enum((Enum *)auStack_78,(string *)enum_def);
            stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_78;
            new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auStack_78 = (undefined1  [8])0x0;
            stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            auStack_a8 = (undefined1  [8])
                         new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
            func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)
                     stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pvVar3 = &((stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                *(int *)&(pvVar3->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar3->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
                UNLOCK();
              }
              else {
                pvVar3 = &((stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                *(int *)&(pvVar3->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar3->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
              }
            }
            SwitchStmt::add_switch_case
                      ((SwitchStmt *)_Var6._M_p,
                       (shared_ptr<kratos::Const> *)
                       &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(shared_ptr<kratos::Stmt> *)auStack_a8);
            if (func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         func_stmt.
                         super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            iVar9 = 4;
          }
          else {
            local_128 = *(undefined1 (*) [8])&(_Var13._M_pi)->_M_use_count;
            if (!bVar10) {
              bVar10 = true;
            }
            iVar9 = 5;
          }
        }
        else {
          if (func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            p_Var1 = &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<kratos::Var,void>
                      ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)p_Var1,
                       (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                       ((_Var13._M_pi)->_vptr__Sp_counted_base + 0xd));
            new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,std::shared_ptr<kratos::Var>>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt,(IfStmt **)p_Var2,
                       (allocator<kratos::IfStmt> *)auStack_78,(shared_ptr<kratos::Var> *)p_Var1);
            std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
            _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
                      ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)p_Var2,
                       (IfStmt *)
                       new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            peVar8 = stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount = new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
            peVar7 = if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)peVar8;
            if (peVar7 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7);
            }
            if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                     )*(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                        *)&(_Var13._M_pi)->_M_use_count;
            get_next_state_stmt((FSM *)&stmt_1.
                                        super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,(Enum *)this,(EnumVar *)enum_def,
                                (FSMState *)next_state,
                                (FSMState *)(__k._M_pi)->_vptr__Sp_counted_base,
                                (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_R9.values_);
            new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                 stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
            stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pvVar3 = &((new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                *(int *)&(pvVar3->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar3->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
                UNLOCK();
              }
              else {
                pvVar3 = &((new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                *(int *)&(pvVar3->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar3->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
              }
            }
            IfStmt::add_then_stmt
                      ((IfStmt *)
                       func_stmt.
                       super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,
                       (shared_ptr<kratos::Stmt> *)
                       &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            auStack_78 = (undefined1  [8])0x0;
            stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if (this->moore_ == false) {
              get_func_call_stmt((shared_ptr<kratos::FunctionStmtBlock> *)auStack_118,
                                 *(FSMState **)&(_Var13._M_pi)->_M_use_count,
                                 (shared_ptr<kratos::FunctionCallStmt> *)auStack_78);
              new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_78;
              stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  pvVar3 = &((stmt_1.
                              super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                  *(int *)&(pvVar3->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start =
                       *(int *)&(pvVar3->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1;
                  UNLOCK();
                }
                else {
                  pvVar3 = &((stmt_1.
                              super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                  *(int *)&(pvVar3->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start =
                       *(int *)&(pvVar3->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1;
                }
              }
              IfStmt::add_then_stmt
                        ((IfStmt *)
                         func_stmt.
                         super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi,
                         (shared_ptr<kratos::Stmt> *)
                         &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
            }
            func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount = func_stmt.
                          super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&top_if,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
            if ((this->generator_->debug == true) && (auStack_78 != (undefined1  [8])0x0)) {
              add_debug_info((FSMState *)(__k._M_pi)->_vptr__Sp_counted_base,
                             (shared_ptr<kratos::FunctionCallStmt> *)auStack_78);
              new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_5a4ff8;
              stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   CONCAT44(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._4_4_,0x103);
              std::
              vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
              ::emplace_back<std::pair<char_const*,int>>
                        ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                          *)((long)auStack_78 + 8),
                         (pair<const_char_*,_int> *)
                         &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
          }
          else {
            p_Var1 = &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<kratos::Var,void>
                      ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)p_Var1,
                       (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                       ((_Var13._M_pi)->_vptr__Sp_counted_base + 0xd));
            stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,std::shared_ptr<kratos::Var>>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_if,(IfStmt **)p_Var2,
                       (allocator<kratos::IfStmt> *)auStack_78,(shared_ptr<kratos::Var> *)p_Var1);
            std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
            _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
                      ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)p_Var2,
                       (IfStmt *)
                       stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                     )*(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                        *)&(_Var13._M_pi)->_M_use_count;
            get_next_state_stmt((FSM *)auStack_78,(Enum *)this,(EnumVar *)enum_def,
                                (FSMState *)next_state,
                                (FSMState *)(__k._M_pi)->_vptr__Sp_counted_base,
                                (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_R9.values_);
            auStack_a8 = (undefined1  [8])0x0;
            func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_78;
            stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pvVar3 = &((stmt_1.
                            super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                *(int *)&(pvVar3->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar3->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
                UNLOCK();
              }
              else {
                pvVar3 = &((stmt_1.
                            super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                *(int *)&(pvVar3->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar3->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
              }
            }
            IfStmt::add_then_stmt
                      ((IfStmt *)
                       stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,
                       (shared_ptr<kratos::Stmt> *)
                       &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            if (this->moore_ == false) {
              get_func_call_stmt((shared_ptr<kratos::FunctionStmtBlock> *)auStack_118,
                                 *(FSMState **)&(_Var13._M_pi)->_M_use_count,
                                 (shared_ptr<kratos::FunctionCallStmt> *)auStack_a8);
              new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_a8;
              stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   func_stmt.
                   super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr != (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  pvVar3 = &((func_stmt.
                              super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                  *(int *)&(pvVar3->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start =
                       *(int *)&(pvVar3->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1;
                  UNLOCK();
                }
                else {
                  pvVar3 = &((func_stmt.
                              super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                  *(int *)&(pvVar3->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start =
                       *(int *)&(pvVar3->
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1;
                }
              }
              IfStmt::add_then_stmt
                        ((IfStmt *)
                         stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi,
                         (shared_ptr<kratos::Stmt> *)
                         &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
            }
            if ((this->generator_->debug == true) && (auStack_a8 != (undefined1  [8])0x0)) {
              add_debug_info((FSMState *)(__k._M_pi)->_vptr__Sp_counted_base,
                             (shared_ptr<kratos::FunctionCallStmt> *)auStack_a8);
              new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_5a4ff8;
              stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   CONCAT44(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._4_4_,0x103);
              std::
              vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
              ::emplace_back<std::pair<char_const*,int>>
                        ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                          *)&(((Stmt *)auStack_a8)->super_IRNode).fn_name_ln,
                         (pair<const_char_*,_int> *)
                         &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                 stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
            stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pvVar3 = &((new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                *(int *)&(pvVar3->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar3->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
                UNLOCK();
              }
              else {
                pvVar3 = &((new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
                *(int *)&(pvVar3->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar3->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
              }
            }
            IfStmt::add_else_stmt
                      ((IfStmt *)
                       func_stmt.
                       super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,
                       (shared_ptr<kratos::Stmt> *)
                       &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount = stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_if);
            if (func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         func_stmt.
                         super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
          }
          if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
          if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          iVar9 = 0;
        }
      } while (((iVar9 == 5) || (iVar9 == 0)) &&
              (_Var13._M_pi = _Var13._M_pi + 1,
              _Var13._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              transitions.
              super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start));
    }
    if (bVar10) {
      in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
               )local_128;
      get_next_state_stmt((FSM *)&stmt_1.
                                  super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,(Enum *)this,(EnumVar *)enum_def,
                          (FSMState *)next_state,(FSMState *)(__k._M_pi)->_vptr__Sp_counted_base,
                          (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_128);
      new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
           stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pvVar3 = &((new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar3->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar3->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          pvVar3 = &((new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar3->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar3->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      IfStmt::add_else_stmt
                ((IfStmt *)
                 func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,
                 (shared_ptr<kratos::Stmt> *)
                 &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      auStack_78 = (undefined1  [8])0x0;
      stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (this->moore_ == false) {
        get_func_call_stmt((shared_ptr<kratos::FunctionStmtBlock> *)auStack_118,
                           (FSMState *)local_128,(shared_ptr<kratos::FunctionCallStmt> *)auStack_78)
        ;
        new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_78;
        stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pvVar3 = &((stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
            *(int *)&(pvVar3->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar3->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            pvVar3 = &((stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
            *(int *)&(pvVar3->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar3->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        IfStmt::add_then_stmt
                  ((IfStmt *)
                   func_stmt.
                   super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi,
                   (shared_ptr<kratos::Stmt> *)
                   &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
        }
      }
      if ((this->generator_->debug == true) && (auStack_78 != (undefined1  [8])0x0)) {
        add_debug_info((FSMState *)(__k._M_pi)->_vptr__Sp_counted_base,
                       (shared_ptr<kratos::FunctionCallStmt> *)auStack_78);
        new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_5a4ff8;
        stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             CONCAT44(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      ._4_4_,0x103);
        std::
        vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
        ::emplace_back<std::pair<char_const*,int>>
                  ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    *)((long)auStack_78 + 8),
                   (pair<const_char_*,_int> *)
                   &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
      }
      if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    _Var6._M_p = local_e8._M_p;
    if (!bVar14) {
      if (func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (((key_type)(__k._M_pi)->_vptr__Sp_counted_base)->name_)._M_dataplus._M_p;
        new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (((key_type)(__k._M_pi)->_vptr__Sp_counted_base)->name_)._M_string_length;
        format_str.size_ = 0xd;
        format_str.data_ = (char *)0x31;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)
                 &stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)
                   &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(detail *)"Unable to find any state transition for state {0}",
                   format_str,args);
        InternalException::InternalException
                  (this_02,(string *)
                           &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        __cxa_throw(this_02,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      Enum::get_enum((Enum *)&stmt_1.
                              super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(string *)enum_def);
      new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
           stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      auStack_78 = (undefined1  [8])
                   func_def.
                   super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pvVar3 = &((top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar3->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar3->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          pvVar3 = &((top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar3->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar3->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      SwitchStmt::add_switch_case
                ((SwitchStmt *)_Var6._M_p,
                 (shared_ptr<kratos::Const> *)
                 &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (shared_ptr<kratos::Stmt> *)auStack_78);
      if (stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
      }
      if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    if (case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete(case_state_comb.
                      super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi,(long)transitions.
                                   super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)case_state_comb.
                                   super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
    }
    if (top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    __k._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&(__k._M_pi)->_M_use_count;
    this_00 = local_160;
  } while( true );
}

Assistant:

void FSM::generate_state_transition(
    Enum& enum_def, EnumVar& current_state, EnumVar& next_state,
    const std::unordered_map<FSMState*, std::string>& state_name_mapping) {
    auto state_comb = generator_->combinational();

    std::shared_ptr<FunctionStmtBlock> func_def = nullptr;
    if (!moore_) func_def = get_func_def();
    auto case_state_comb = std::make_shared<SwitchStmt>(current_state.shared_from_this());
    auto states = get_all_child_states(false);

    auto add_debug_info_to_stmt = [this](std::shared_ptr<FunctionCallStmt>& func_stmt,
                                         const FSMState* state) {
        if (generator_->debug) {
            if (func_stmt) {
                add_debug_info(state, func_stmt);
                func_stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
        }
    };
    for (auto const& state : states) {
        auto const& state_name = state_name_mapping.at(state);
        // a list of if statements
        std::shared_ptr<IfStmt> if_ = nullptr;
        std::shared_ptr<IfStmt> top_if = nullptr;
        auto transitions = state->transitions();
        // slide through condition
        bool has_slide_through = false;
        if (transitions.size() == 1 && transitions[0].first == nullptr) {
            has_slide_through = true;
        }
        std::optional<std::pair<Var *, FSMState *>> default_state;
        for (auto const& [cond, next_fsm_state] : transitions) {
            if (!cond && (transitions.size() == 1)) {
                // direct transition
                auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                                state_name_mapping);
                case_state_comb->add_switch_case(enum_def.get_enum(state_name), stmt);
                break;
            } else if (!cond) {
                // we have a default case here
                default_state= std::make_pair(cond, next_fsm_state);
                continue;
            }

            if (!if_) {
                if_ = std::make_shared<IfStmt>(cond->shared_from_this());
                auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                                state_name_mapping);
                if_->add_then_stmt(stmt);
                // mealy machine need to add extra state transition outputs
                std::shared_ptr<FunctionCallStmt> func_stmt = nullptr;
                if (!moore_) {
                    get_func_call_stmt(func_def, next_fsm_state, func_stmt);
                    if_->add_then_stmt(func_stmt);
                }
                top_if = if_;
                add_debug_info_to_stmt(func_stmt, state);
            } else {
                auto new_if = std::make_shared<IfStmt>(cond->shared_from_this());
                auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                                state_name_mapping);
                // mealy machine need to add extra state transition outputs
                std::shared_ptr<FunctionCallStmt> func_stmt = nullptr;
                new_if->add_then_stmt(stmt);
                if (!moore_) {
                    get_func_call_stmt(func_def, next_fsm_state, func_stmt);
                    new_if->add_then_stmt(func_stmt);
                }
                add_debug_info_to_stmt(func_stmt, state);
                if_->add_else_stmt(new_if);
                if_ = new_if;
            }
        }

        if (default_state) {
            auto* next_fsm_state = default_state->second;
            auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                            state_name_mapping);
            if_->add_else_stmt(stmt);
            // mealy machine need to add extra state transition outputs
            std::shared_ptr<FunctionCallStmt> func_stmt = nullptr;
            if (!moore_) {
                get_func_call_stmt(func_def, next_fsm_state, func_stmt);
                if_->add_then_stmt(func_stmt);
            }
            add_debug_info_to_stmt(func_stmt, state);
        }

        if (!has_slide_through) {
            if (!top_if)
                throw InternalException(
                    ::format("Unable to find any state transition for state {0}", state->name()));
            case_state_comb->add_switch_case(enum_def.get_enum(state_name), top_if);
        }
    }

    // prevent latch generation
    state_comb->add_stmt(next_state.assign(current_state, AssignmentType::Blocking));

    // also default case
    if (case_state_comb->body().find(nullptr) == case_state_comb->body().end() &&
        !is_2_power(case_state_comb->body().size())) {
        case_state_comb->add_switch_case(
            nullptr, next_state.assign(current_state, AssignmentType::Blocking));
    }

    // add it to the state_comb
    state_comb->add_stmt(case_state_comb);
}